

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType2::operator==(GridDataType2 *this,GridDataType2 *Value)

{
  KBOOL KVar1;
  bool bVar2;
  GridDataType2 *Value_local;
  GridDataType2 *this_local;
  
  KVar1 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (*(short *)&(this->super_GridData).field_0xc ==
           *(short *)&(Value->super_GridData).field_0xc) {
    bVar2 = std::operator!=(&this->m_vf32Values,&Value->m_vf32Values);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GridDataType2::operator == ( const GridDataType2 & Value ) const
{
    if( GridData::operator != ( Value ) )           return false;
    if( m_ui16NumValues  != Value.m_ui16NumValues ) return false;
    if( m_vf32Values     != Value.m_vf32Values )    return false;
    return true;
}